

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaFreeType(xmlSchemaTypePtr type)

{
  _xmlSchemaAnnot *p_Var1;
  _xmlSchemaFacet *p_Var2;
  undefined8 *puVar3;
  _xmlSchemaTypeLink *p_Var4;
  _xmlSchemaFacetLink *p_Var5;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypeLinkPtr pxVar6;
  xmlSchemaFacetLinkPtr pxVar7;
  xmlSchemaAnnotPtr pxVar8;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    return;
  }
  pxVar8 = type->annot;
  if (pxVar8 != (xmlSchemaAnnotPtr)0x0) {
    if (pxVar8->next == (_xmlSchemaAnnot *)0x0) {
      (*xmlFree)(pxVar8);
    }
    else {
      do {
        p_Var1 = pxVar8->next;
        (*xmlFree)(pxVar8);
        pxVar8 = p_Var1;
      } while (p_Var1 != (_xmlSchemaAnnot *)0x0);
    }
  }
  facet = type->facets;
  while (facet != (xmlSchemaFacetPtr)0x0) {
    p_Var2 = facet->next;
    xmlSchemaFreeFacet(facet);
    facet = p_Var2;
  }
  puVar3 = (undefined8 *)type->attrUses;
  if (puVar3 != (undefined8 *)0x0) {
    if ((void *)*puVar3 != (void *)0x0) {
      (*xmlFree)((void *)*puVar3);
    }
    (*xmlFree)(puVar3);
  }
  pxVar6 = type->memberTypes;
  while (pxVar6 != (xmlSchemaTypeLinkPtr)0x0) {
    p_Var4 = pxVar6->next;
    (*xmlFree)(pxVar6);
    pxVar6 = p_Var4;
  }
  pxVar7 = type->facetSet;
  while (pxVar7 != (xmlSchemaFacetLinkPtr)0x0) {
    p_Var5 = pxVar7->next;
    (*xmlFree)(pxVar7);
    pxVar7 = p_Var5;
  }
  if (type->contModel != (xmlRegexpPtr)0x0) {
    xmlRegFreeRegexp(type->contModel);
  }
  (*xmlFree)(type);
  return;
}

Assistant:

void
xmlSchemaFreeType(xmlSchemaTypePtr type)
{
    if (type == NULL)
        return;
    if (type->annot != NULL)
        xmlSchemaFreeAnnot(type->annot);
    if (type->facets != NULL) {
        xmlSchemaFacetPtr facet, next;

        facet = type->facets;
        while (facet != NULL) {
            next = facet->next;
            xmlSchemaFreeFacet(facet);
            facet = next;
        }
    }
    if (type->attrUses != NULL)
	xmlSchemaItemListFree((xmlSchemaItemListPtr) type->attrUses);
    if (type->memberTypes != NULL)
	xmlSchemaFreeTypeLinkList(type->memberTypes);
    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr next, link;

	link = type->facetSet;
	do {
	    next = link->next;
	    xmlFree(link);
	    link = next;
	} while (link != NULL);
    }
    if (type->contModel != NULL)
        xmlRegFreeRegexp(type->contModel);
    xmlFree(type);
}